

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O1

void __thiscall OpenMD::GCNSeq::doFrame(GCNSeq *this,int istep)

{
  double *pdVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  double dVar3;
  SimInfo *pSVar4;
  pointer piVar5;
  iterator iVar6;
  _func_int **pp_Var7;
  pointer pvVar8;
  pointer pvVar9;
  pointer piVar10;
  pointer ppSVar11;
  pointer ppSVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppBVar15;
  pointer ppBVar16;
  pointer ppTVar17;
  pointer ppTVar18;
  pointer ppIVar19;
  pointer ppIVar20;
  pointer ppMVar21;
  pointer ppMVar22;
  uint i;
  int iVar23;
  ulong uVar24;
  StuntDouble *pSVar25;
  long lVar26;
  ostream *poVar27;
  pointer *ppiVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  pointer pvVar34;
  uint uVar35;
  double tmp;
  double dVar36;
  undefined1 auVar37 [16];
  int iterator1;
  vector<int,_std::allocator<int>_> globalToLocal;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  listNN;
  Vector3d diff;
  int iterator2;
  vector<double,_std::allocator<double>_> histo;
  Vector3d pos2;
  Vector3d pos1;
  int local_29c;
  vector<int,_std::allocator<int>_> local_298;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_278;
  int local_25c;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_258;
  SelectionManager *local_240;
  Vector3d local_238;
  double local_218;
  int local_20c;
  SelectionManager local_208;
  double local_138 [4];
  double local_118 [4];
  SelectionManager local_f8;
  
  local_25c = istep;
  SelectionManager::SelectionManager(&local_f8,(this->super_SequentialAnalyzer).info_);
  local_278.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_118[2] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_138[2] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_238.super_Vector<double,_3U>.data_[2] = 0.0;
  local_238.super_Vector<double,_3U>.data_[0]._0_4_ = 0;
  local_238.super_Vector<double,_3U>.data_[0]._4_4_ = 0;
  local_238.super_Vector<double,_3U>.data_[1] = 0.0;
  iVar23 = OpenMDBitSet::countBits
                     ((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  this->selectionCount1_ = iVar23;
  iVar23 = OpenMDBitSet::countBits
                     ((this->super_SequentialAnalyzer).seleMan2_.ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_240 = &(this->super_SequentialAnalyzer).seleMan1_;
  this->selectionCount2_ = iVar23;
  operator|(&local_208,local_240,&(this->super_SequentialAnalyzer).seleMan2_);
  local_258.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f8.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_258.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f8.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_258.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_f8.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.info_ = local_208.info_;
  local_f8.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_208.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_208.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.ss_.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_258);
  piVar10 = local_f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  piVar5 = local_f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)piVar10 - (long)piVar5);
  }
  ppSVar12 = local_f8.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppSVar11 = local_f8.stuntdoubles_.
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f8.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_208.stuntdoubles_.
       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_208.stuntdoubles_.
       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.stuntdoubles_.
       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.stuntdoubles_.
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppSVar11 != (pointer)0x0) {
    operator_delete(ppSVar11,(long)ppSVar12 - (long)ppSVar11);
  }
  ppBVar14 = local_f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppBVar13 = local_f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppBVar13 != (pointer)0x0) {
    operator_delete(ppBVar13,(long)ppBVar14 - (long)ppBVar13);
  }
  ppBVar16 = local_f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppBVar15 = local_f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppBVar15 != (pointer)0x0) {
    operator_delete(ppBVar15,(long)ppBVar16 - (long)ppBVar15);
  }
  ppTVar18 = local_f8.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppTVar17 = local_f8.torsions_.
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppTVar17 != (pointer)0x0) {
    operator_delete(ppTVar17,(long)ppTVar18 - (long)ppTVar17);
  }
  ppIVar20 = local_f8.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppIVar19 = local_f8.inversions_.
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f8.inversions_.super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_208.inversions_.
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.inversions_.super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_208.inversions_.
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.inversions_.super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_208.inversions_.
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar19 != (pointer)0x0) {
    operator_delete(ppIVar19,(long)ppIVar20 - (long)ppIVar19);
  }
  ppMVar22 = local_f8.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ppMVar21 = local_f8.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_208.molecules_.
       super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_208.molecules_.
       super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_208.molecules_.
       super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_208.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppMVar21 != (pointer)0x0) {
    operator_delete(ppMVar21,(long)ppMVar22 - (long)ppMVar21);
  }
  SelectionManager::~SelectionManager(&local_208);
  iVar23 = OpenMDBitSet::countBits
                     (local_f8.ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  pSVar4 = (this->super_SequentialAnalyzer).info_;
  local_208.info_ = (SimInfo *)CONCAT44(local_208.info_._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize
            (&local_298,(long)pSVar4->nGlobalRigidBodies_ + (long)pSVar4->nGlobalAtoms_,
             (value_type_conflict2 *)&local_208);
  pvVar9 = local_278.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = local_278.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_278.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_278.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar24 = ((long)local_278.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    ppiVar28 = &((local_278.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
    uVar29 = 1;
    do {
      if (*ppiVar28 != ((_Vector_impl_data *)(ppiVar28 + -1))->_M_start) {
        *ppiVar28 = ((_Vector_impl_data *)(ppiVar28 + -1))->_M_start;
      }
      uVar31 = (ulong)uVar29;
      ppiVar28 = ppiVar28 + 3;
      uVar29 = uVar29 + 1;
    } while (uVar31 <= uVar24 && uVar24 - uVar31 != 0);
  }
  pvVar34 = local_278.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_278.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_278.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      piVar5 = (pvVar34->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar5 != (pointer)0x0) {
        operator_delete(piVar5,(long)(pvVar34->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)piVar5);
      }
      pvVar34 = pvVar34 + 1;
    } while (pvVar34 != pvVar9);
    local_278.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar8;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&local_278,(long)iVar23);
  local_208.info_ = (SimInfo *)0x0;
  local_208.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.ss_.bitsets_.
  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_258.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_208,(long)this->bins_,
             (value_type_conflict1 *)&local_258);
  pSVar25 = SelectionManager::beginSelected(&local_f8,&local_29c);
  if (pSVar25 != (StuntDouble *)0x0) {
    uVar29 = 0;
    do {
      uVar24 = (ulong)pSVar25->globalIndex_;
      if ((ulong)((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar24) goto LAB_00122613;
      local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar24] = uVar29;
      lVar26 = *(long *)((long)&(pSVar25->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar25->storage_);
      local_118[2] = *(double *)(lVar26 + 0x10 + (long)pSVar25->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar26 + (long)pSVar25->localIndex_ * 0x18);
      local_118[0] = *pdVar1;
      local_118[1] = pdVar1[1];
      pSVar25 = SelectionManager::beginSelected(&local_f8,&local_20c);
      if (pSVar25 != (StuntDouble *)0x0) {
        uVar32 = (ulong)uVar29;
        uVar31 = 0;
        do {
          uVar35 = (uint)uVar31;
          if (uVar29 < uVar35) {
            lVar26 = *(long *)((long)&(pSVar25->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar25->storage_)
            ;
            local_138[2] = (double)*(undefined8 *)
                                    (lVar26 + 0x10 + (long)pSVar25->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar26 + (long)pSVar25->localIndex_ * 0x18);
            local_138[0] = *pdVar1;
            local_138[1] = pdVar1[1];
            local_258.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0;
            local_258.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = 0;
            local_258.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_258.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar26 = 0;
            do {
              (&local_258.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar26] =
                   (pointer)(local_138[lVar26] - local_118[lVar26]);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            local_238.super_Vector<double,_3U>.data_[2] =
                 (double)local_258.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_238.super_Vector<double,_3U>.data_[0]._0_4_ =
                 (uint)local_258.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_238.super_Vector<double,_3U>.data_[0]._4_4_ =
                 local_258.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_;
            local_238.super_Vector<double,_3U>.data_[1] =
                 (double)local_258.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (this->usePBC_ != false) {
              Snapshot::wrapVector((this->super_SequentialAnalyzer).currentSnapshot_,&local_238);
            }
            dVar36 = 0.0;
            lVar26 = 0;
            do {
              dVar3 = local_238.super_Vector<double,_3U>.data_[lVar26];
              dVar36 = dVar36 + dVar3 * dVar3;
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            if (dVar36 < 0.0) {
              dVar36 = sqrt(dVar36);
            }
            else {
              dVar36 = SQRT(dVar36);
            }
            if (dVar36 < this->rCut_) {
              uVar30 = ((long)local_278.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              uVar24 = uVar32;
              if (uVar30 < uVar32 || uVar30 - uVar32 == 0) goto LAB_00122613;
              pvVar2 = local_278.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar32;
              iVar6._M_current =
                   (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              local_258.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar35;
              if (iVar6._M_current ==
                  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (pvVar2,iVar6,(int *)&local_258);
              }
              else {
                *iVar6._M_current = uVar35;
                (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              uVar30 = ((long)local_278.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              uVar24 = uVar31;
              if (uVar30 < uVar31 || uVar30 - uVar31 == 0) goto LAB_00122613;
              pvVar2 = local_278.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31;
              iVar6._M_current =
                   (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              local_258.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar29;
              if (iVar6._M_current ==
                  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (pvVar2,iVar6,(int *)&local_258);
              }
              else {
                *iVar6._M_current = uVar29;
                (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
            }
          }
          pSVar25 = SelectionManager::nextSelected(&local_f8,&local_20c);
          uVar31 = (ulong)(uVar35 + 1);
        } while (pSVar25 != (StuntDouble *)0x0);
      }
      pSVar25 = SelectionManager::nextSelected(&local_f8,&local_29c);
      uVar29 = uVar29 + 1;
    } while (pSVar25 != (StuntDouble *)0x0);
  }
  pSVar25 = SelectionManager::beginSelected(local_240,&local_29c);
  while( true ) {
    if (pSVar25 == (StuntDouble *)0x0) {
      if ((long)local_208.ss_.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start - (long)local_208.info_ != 0) {
        iVar23 = this->selectionCount1_;
        uVar24 = 0;
        do {
          if (iVar23 < 1) {
            pp_Var7 = (_func_int **)0x0;
          }
          else {
            pp_Var7 = (_func_int **)
                      ((double)(&(local_208.info_)->_vptr_SimInfo)[uVar24] / (double)iVar23);
          }
          (&(local_208.info_)->_vptr_SimInfo)[uVar24] = pp_Var7;
          uVar24 = uVar24 + 1;
        } while ((uVar24 & 0xffffffff) <
                 (ulong)((long)local_208.ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)local_208.info_ >>
                        3));
      }
      iVar6._M_current =
           (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->count_,iVar6,&this->selectionCount1_);
      }
      else {
        *iVar6._M_current = this->selectionCount1_;
        (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar6._M_current + 1;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&this->histogram_,(value_type *)&local_208);
      if (local_208.info_ != (SimInfo *)0x0) {
        operator_delete(local_208.info_,
                        (long)local_208.ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_208.info_);
      }
      if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_278);
      SelectionManager::~SelectionManager(&local_f8);
      return;
    }
    uVar24 = (ulong)pSVar25->globalIndex_;
    if ((ulong)((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar24) break;
    uVar32 = (ulong)(uint)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar24];
    uVar31 = ((long)local_278.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar24 = uVar32;
    if (uVar31 < uVar32 || uVar31 - uVar32 == 0) {
LAB_00122602:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24)
      ;
    }
    piVar5 = local_278.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar32].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    dVar36 = 0.0;
    uVar29 = 1;
    uVar30 = 0;
    while (uVar30 < (ulong)((long)local_278.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar32].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) {
      uVar24 = (ulong)(uint)piVar5[uVar30];
      if (uVar31 < uVar24 || uVar31 - uVar24 == 0) goto LAB_00122602;
      lVar26 = (long)local_278.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish -
               (long)local_278.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
      lVar33 = lVar26 >> 2;
      uVar30 = (ulong)uVar29;
      uVar29 = uVar29 + 1;
      auVar37._8_4_ = (int)(lVar26 >> 0x22);
      auVar37._0_8_ = lVar33;
      auVar37._12_4_ = 0x45300000;
      dVar36 = dVar36 + (auVar37._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0);
      uVar24 = uVar32;
      if (uVar31 < uVar32 || uVar31 - uVar32 == 0) goto LAB_00122602;
    }
    local_218 = dVar36 / (double)this->nnMax_;
    uVar24 = (ulong)(uint)(int)(local_218 / this->delta_);
    if (uVar24 < (ulong)((long)local_208.ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)local_208.info_ >>
                        3)) {
      (&(local_208.info_)->_vptr_SimInfo)[uVar24] =
           (_func_int **)((double)(&(local_208.info_)->_vptr_SimInfo)[uVar24] + 1.0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In frame ",9);
      poVar27 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_25c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,", object ",9);
      poVar27 = (ostream *)std::ostream::operator<<((ostream *)poVar27,pSVar25->globalIndex_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27," has GCN value = ",0x11);
      poVar27 = std::ostream::_M_insert<double>(local_218);
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
    }
    pSVar25 = SelectionManager::nextSelected(local_240,&local_29c);
  }
LAB_00122613:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24);
}

Assistant:

void GCNSeq::doFrame(int istep) {
    SelectionManager common(info_);

    std::vector<std::vector<int>> listNN;
    std::vector<int> globalToLocal;

    StuntDouble* sd1;
    StuntDouble* sd2;

    int iterator1;
    int iterator2;
    unsigned int mapIndex1(0);
    unsigned int mapIndex2(0);
    unsigned int tempIndex(0);
    unsigned int whichBin(0);
    RealType gcn(0.0);
    Vector3d pos1;
    Vector3d pos2;
    Vector3d diff;
    RealType distance;

    // First have to calculate lists of nearest neighbors (listNN_):

    selectionCount1_ = seleMan1_.getSelectionCount();
    selectionCount2_ = seleMan2_.getSelectionCount();

    // We need a common selection set:
    common          = seleMan1_ | seleMan2_;
    int commonCount = common.getSelectionCount();

    globalToLocal.clear();
    globalToLocal.resize(
        info_->getNGlobalAtoms() + info_->getNGlobalRigidBodies(), -1);
    for (unsigned int i = 0; i < listNN.size(); i++)
      listNN.at(i).clear();
    listNN.clear();
    listNN.resize(commonCount);
    std::vector<RealType> histo;
    histo.resize(bins_, 0.0);

    mapIndex1 = 0;
    for (sd1 = common.beginSelected(iterator1); sd1 != NULL;
         sd1 = common.nextSelected(iterator1)) {
      globalToLocal.at(sd1->getGlobalIndex()) = mapIndex1;

      pos1 = sd1->getPos();

      mapIndex2 = 0;
      for (sd2 = common.beginSelected(iterator2); sd2 != NULL;
           sd2 = common.nextSelected(iterator2)) {
        if (mapIndex1 < mapIndex2) {
          pos2 = sd2->getPos();
          diff = pos2 - pos1;
          if (usePBC_) currentSnapshot_->wrapVector(diff);
          distance = diff.length();
          if (distance < rCut_) {
            listNN.at(mapIndex1).push_back(mapIndex2);
            listNN.at(mapIndex2).push_back(mapIndex1);
          }
        }
        mapIndex2++;
      }
      mapIndex1++;
    }

    // Fill up the histogram with gcn values
    for (sd1 = seleMan1_.beginSelected(iterator1); sd1 != NULL;
         sd1 = seleMan1_.nextSelected(iterator1)) {
      mapIndex1 = globalToLocal.at(sd1->getGlobalIndex());
      gcn       = 0.0;
      for (unsigned int i = 0; i < listNN.at(mapIndex1).size(); i++) {
        // tempIndex is the index of one of i's nearest neighbors
        tempIndex = listNN.at(mapIndex1).at(i);
        gcn += listNN.at(tempIndex).size();
      }

      gcn      = gcn / nnMax_;
      whichBin = int(gcn / delta_);
      if (whichBin < histo.size()) {
        histo[whichBin] += 1;
      } else {
        cerr << "In frame " << istep << ", object " << sd1->getGlobalIndex()
             << " has GCN value = " << gcn << "\n";
      }
    }

    for (unsigned int n = 0; n < histo.size(); n++) {
      if (selectionCount1_ > 0)
        histo[n] /= RealType(selectionCount1_);
      else
        histo[n] = 0.0;
    }

    count_.push_back(selectionCount1_);
    histogram_.push_back(histo);
  }